

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_fusefref(ASMState *as,IRIns *ir,RegSet allow)

{
  uint uVar1;
  Reg RVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  
  (as->mrm).idx = 0x80;
  if ((ir->field_0).op1 == 0x7fff) {
    uVar1 = (uint)(ir->field_0).op2 * 4;
LAB_001434b3:
    (as->mrm).ofs = uVar1 - 0x1018;
  }
  else {
    bVar3 = "\x14\x10 \nH`h \x10(04\n \n008@HPX\n\x10\x10\x10\x14"[(ir->field_0).op2];
    (as->mrm).ofs = (uint)bVar3;
    lVar4 = (long)(short)(ir->field_0).op1;
    if (lVar4 < 0) {
LAB_001434f3:
      bVar3 = *(byte *)((long)as->ir + (ulong)(ir->field_0).op1 * 8 + 6);
      if ((char)bVar3 < '\0') {
        RVar2 = ra_allocref(as,(uint)(ir->field_0).op1,allow);
        bVar3 = (byte)RVar2;
      }
      as->weakset = as->weakset & (-2 << (bVar3 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar3 & 0x1f));
      goto LAB_0014351d;
    }
    uVar1 = (uint)bVar3;
    if ((ir->field_0).op1 == 0x7fff) goto LAB_001434b3;
    if ((1 < (byte)(*(char *)((long)as->ir + lVar4 * 8 + 5) - 0x19U)) ||
       (lVar4 = (long)as->ir[lVar4 + 1] - (long)as->J, lVar5 = (ulong)(uint)bVar3 + lVar4 + -0xcc8,
       (int)lVar5 != lVar5)) goto LAB_001434f3;
    (as->mrm).ofs = (int)lVar4 + -0xcc8 + uVar1;
  }
  bVar3 = 0xe;
LAB_0014351d:
  (as->mrm).base = bVar3;
  return;
}

Assistant:

static void asm_fusefref(ASMState *as, IRIns *ir, RegSet allow)
{
  lj_assertA(ir->o == IR_FLOAD || ir->o == IR_FREF,
	     "bad IR op %d", ir->o);
  as->mrm.idx = RID_NONE;
  if (ir->op1 == REF_NIL) {  /* FLOAD from GG_State with offset. */
#if LJ_GC64
    as->mrm.ofs = (int32_t)(ir->op2 << 2) - GG_OFS(dispatch);
    as->mrm.base = RID_DISPATCH;
#else
    as->mrm.ofs = (int32_t)(ir->op2 << 2) + ptr2addr(J2GG(as->J));
    as->mrm.base = RID_NONE;
#endif
    return;
  }
  as->mrm.ofs = field_ofs[ir->op2];
  if (irref_isk(ir->op1)) {
    IRIns *op1 = IR(ir->op1);
#if LJ_GC64
    if (ir->op1 == REF_NIL) {
      as->mrm.ofs -= GG_OFS(dispatch);
      as->mrm.base = RID_DISPATCH;
      return;
    } else if (op1->o == IR_KPTR || op1->o == IR_KKPTR) {
      intptr_t ofs = dispofs(as, ir_kptr(op1));
      if (checki32(as->mrm.ofs + ofs)) {
	as->mrm.ofs += (int32_t)ofs;
	as->mrm.base = RID_DISPATCH;
	return;
      }
    }
#else
    as->mrm.ofs += op1->i;
    as->mrm.base = RID_NONE;
    return;
#endif
  }
  as->mrm.base = (uint8_t)ra_alloc1(as, ir->op1, allow);
}